

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

string * __thiscall
flatbuffers::BaseGenerator::GeneratedFileName
          (string *__return_storage_ptr__,BaseGenerator *this,string *path,string *file_name,
          IDLOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,path,file_name);
  std::operator+(&local_80,&local_40,&options->filename_suffix);
  std::operator+(&local_60,&local_80,".");
  __rhs = &this->default_extension_;
  if ((options->filename_extension)._M_string_length != 0) {
    __rhs = &options->filename_extension;
  }
  std::operator+(__return_storage_ptr__,&local_60,__rhs);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::GeneratedFileName(const std::string &path,
                                             const std::string &file_name,
                                             const IDLOptions &options) const {
  return path + file_name + options.filename_suffix + "." +
         (options.filename_extension.empty() ? default_extension_
                                             : options.filename_extension);
}